

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O3

void ModifyDropAmount(AInventory *inv,int dropamount)

{
  byte *pbVar1;
  DObject *pDVar2;
  double dVar3;
  PClass *pPVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  int iVar7;
  PClass *pPVar8;
  PClass *pPVar9;
  bool bVar10;
  double dVar11;
  PClass *pPVar6;
  
  dVar3 = G_SkillProperty(SKILLP_DropAmmoFactor);
  pPVar9 = AAmmo::RegistrationInfo.MyClass;
  dVar11 = (double)(~-(ulong)(dVar3 == -1.0) & (ulong)dVar3 |
                   -(ulong)(dVar3 == -1.0) & 0x3fe0000000000000);
  if (dropamount < 1) {
    pPVar6 = (inv->super_AActor).super_DThinker.super_DObject.Class;
    if (pPVar6 == (PClass *)0x0) {
      iVar5 = (**(inv->super_AActor).super_DThinker.super_DObject._vptr_DObject)(inv);
      pPVar6 = (PClass *)CONCAT44(extraout_var_00,iVar5);
      (inv->super_AActor).super_DThinker.super_DObject.Class = pPVar6;
    }
    pPVar4 = AWeaponGiver::RegistrationInfo.MyClass;
    bVar10 = pPVar6 != (PClass *)0x0;
    pPVar8 = pPVar6;
    if (pPVar6 != pPVar9 && bVar10) {
      do {
        pPVar8 = pPVar8->ParentClass;
        bVar10 = pPVar8 != (PClass *)0x0;
        if (pPVar8 == pPVar9) break;
      } while (pPVar8 != (PClass *)0x0);
    }
    if (bVar10) {
      if (pPVar6 == (PClass *)0x0) {
        iVar5 = (**(inv->super_AActor).super_DThinker.super_DObject._vptr_DObject)(inv);
        pPVar6 = (PClass *)CONCAT44(extraout_var_01,iVar5);
        (inv->super_AActor).super_DThinker.super_DObject.Class = pPVar6;
      }
      iVar5 = *(int *)&pPVar6[2].super_PNativeStruct.super_PStruct.super_PNamedType.
                       super_PCompoundType.super_PType.super_PTypeBase.super_DObject;
      if (iVar5 < 1) {
        iVar7 = (int)(dVar11 * (double)inv->Amount);
        iVar5 = 1;
        if (1 < iVar7) {
          iVar5 = iVar7;
        }
      }
      inv->Amount = iVar5;
    }
    else {
      if (pPVar6 == (PClass *)0x0) {
        iVar5 = (**(inv->super_AActor).super_DThinker.super_DObject._vptr_DObject)(inv);
        pPVar6 = (PClass *)CONCAT44(extraout_var_02,iVar5);
        (inv->super_AActor).super_DThinker.super_DObject.Class = pPVar6;
      }
      pPVar8 = AWeapon::RegistrationInfo.MyClass;
      bVar10 = pPVar6 != (PClass *)0x0;
      pPVar9 = pPVar6;
      if (pPVar6 != pPVar4 && bVar10) {
        do {
          pPVar9 = pPVar9->ParentClass;
          bVar10 = pPVar9 != (PClass *)0x0;
          if (pPVar9 == pPVar4) break;
        } while (pPVar9 != (PClass *)0x0);
      }
      if (bVar10) {
        inv[1].super_AActor.Angles.Pitch.Degrees = dVar11;
      }
      else {
        if (pPVar6 == (PClass *)0x0) {
          iVar5 = (**(inv->super_AActor).super_DThinker.super_DObject._vptr_DObject)(inv);
          pPVar6 = (PClass *)CONCAT44(extraout_var_03,iVar5);
          (inv->super_AActor).super_DThinker.super_DObject.Class = pPVar6;
        }
        pPVar4 = ADehackedPickup::RegistrationInfo.MyClass;
        bVar10 = pPVar6 != (PClass *)0x0;
        pPVar9 = pPVar6;
        if (pPVar6 != pPVar8 && bVar10) {
          do {
            pPVar9 = pPVar9->ParentClass;
            bVar10 = pPVar9 != (PClass *)0x0;
            if (pPVar9 == pPVar8) break;
          } while (pPVar9 != (PClass *)0x0);
        }
        if (!bVar10) {
          if (pPVar6 == (PClass *)0x0) {
            iVar5 = (**(inv->super_AActor).super_DThinker.super_DObject._vptr_DObject)(inv);
            pPVar6 = (PClass *)CONCAT44(extraout_var_04,iVar5);
            (inv->super_AActor).super_DThinker.super_DObject.Class = pPVar6;
          }
          bVar10 = pPVar6 != (PClass *)0x0;
          if (pPVar6 != pPVar4 && bVar10) {
            do {
              pPVar6 = pPVar6->ParentClass;
              bVar10 = pPVar6 != (PClass *)0x0;
              if (pPVar6 == pPVar4) break;
            } while (pPVar6 != (PClass *)0x0);
          }
          if (!bVar10) {
            return;
          }
          *(undefined1 *)&inv[1].super_AActor.super_DThinker.super_DObject.Class = 1;
          return;
        }
        pDVar2 = inv[1].super_AActor.super_DThinker.super_DObject.ObjNext;
        inv[1].super_AActor.super_DThinker.super_DObject.ObjNext =
             (DObject *)
             CONCAT44((int)(dVar11 * (double)(int)((ulong)pDVar2 >> 0x20)),
                      (int)(dVar11 * (double)(int)pDVar2));
      }
    }
    inv->ItemFlags = inv->ItemFlags | (-(uint)(dVar3 != -1.0) & 1) << 0xe;
  }
  else {
    if ((dVar3 != -1.0) || (NAN(dVar3))) {
      pPVar6 = (inv->super_AActor).super_DThinker.super_DObject.Class;
      if (pPVar6 == (PClass *)0x0) {
        iVar5 = (**(inv->super_AActor).super_DThinker.super_DObject._vptr_DObject)(inv);
        pPVar6 = (PClass *)CONCAT44(extraout_var,iVar5);
        (inv->super_AActor).super_DThinker.super_DObject.Class = pPVar6;
      }
      bVar10 = pPVar6 != (PClass *)0x0;
      if (pPVar6 != pPVar9 && bVar10) {
        do {
          pPVar6 = pPVar6->ParentClass;
          bVar10 = pPVar6 != (PClass *)0x0;
          if (pPVar6 == pPVar9) break;
        } while (pPVar6 != (PClass *)0x0);
      }
      if (bVar10) {
        inv->Amount = (int)(dVar11 * (double)dropamount);
        pbVar1 = (byte *)((long)&inv->ItemFlags + 1);
        *pbVar1 = *pbVar1 | 0x40;
        return;
      }
    }
    inv->Amount = dropamount;
  }
  return;
}

Assistant:

void ModifyDropAmount(AInventory *inv, int dropamount)
{
	int flagmask = IF_IGNORESKILL;
	double dropammofactor = G_SkillProperty(SKILLP_DropAmmoFactor);
	// Default drop amount is half of regular amount * regular ammo multiplication
	if (dropammofactor == -1) 
	{
		dropammofactor = 0.5;
		flagmask = 0;
	}

	if (dropamount > 0)
	{
		if (flagmask != 0 && inv->IsKindOf(RUNTIME_CLASS(AAmmo)))
		{
			inv->Amount = int(dropamount * dropammofactor);
			inv->ItemFlags |= IF_IGNORESKILL;
		}
		else
		{
			inv->Amount = dropamount;
		}
	}
	else if (inv->IsKindOf (RUNTIME_CLASS(AAmmo)))
	{
		// Half ammo when dropped by bad guys.
		int amount = static_cast<PClassAmmo *>(inv->GetClass())->DropAmount;
		if (amount <= 0)
		{
			amount = MAX(1, int(inv->Amount * dropammofactor));
		}
		inv->Amount = amount;
		inv->ItemFlags |= flagmask;
	}
	else if (inv->IsKindOf (RUNTIME_CLASS(AWeaponGiver)))
	{
		static_cast<AWeaponGiver *>(inv)->DropAmmoFactor = dropammofactor;
		inv->ItemFlags |= flagmask;
	}
	else if (inv->IsKindOf (RUNTIME_CLASS(AWeapon)))
	{
		// The same goes for ammo from a weapon.
		static_cast<AWeapon *>(inv)->AmmoGive1 = int(static_cast<AWeapon *>(inv)->AmmoGive1 * dropammofactor);
		static_cast<AWeapon *>(inv)->AmmoGive2 = int(static_cast<AWeapon *>(inv)->AmmoGive2 * dropammofactor);
		inv->ItemFlags |= flagmask;
	}			
	else if (inv->IsKindOf (RUNTIME_CLASS(ADehackedPickup)))
	{
		// For weapons and ammo modified by Dehacked we need to flag the item.
		static_cast<ADehackedPickup *>(inv)->droppedbymonster = true;
	}
}